

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

logical pnga_locate_region(Integer g_a,Integer *lo,Integer *hi,Integer *map,Integer *proclist,
                          Integer *np)

{
  short sVar1;
  int iVar2;
  C_Integer *pCVar3;
  bool bVar4;
  undefined8 uVar5;
  global_array_t *pgVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  C_Integer CVar10;
  long *plVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  Integer *pIVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  C_Integer CVar26;
  int _ndim;
  ulong uVar27;
  int procT [7];
  int proc_subscript [7];
  Integer max [7];
  int procB [7];
  char err_string [256];
  Integer *local_278;
  ulong local_230;
  long local_228 [8];
  uint local_1e8 [6];
  long alStack_1d0 [9];
  ulong local_188;
  Integer *local_180;
  uint auStack_178 [8];
  int local_158 [8];
  Integer local_138 [33];
  
  lVar23 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar23)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","nga_locate_region");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[lVar23].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","nga_locate_region");
    pnga_error((char *)local_138,g_a);
  }
  pgVar6 = GA;
  sVar1 = GA[lVar23].ndim;
  uVar27 = (ulong)sVar1;
  if (0 < (long)uVar27) {
    uVar12 = 0;
    do {
      if (lo[uVar12] < 1) {
        return 0;
      }
      if (hi[uVar12] < lo[uVar12]) {
        return 0;
      }
      if (GA[lVar23].dims[uVar12] < hi[uVar12]) {
        return 0;
      }
      uVar12 = uVar12 + 1;
    } while (uVar27 != uVar12);
  }
  switch(GA[lVar23].distr_type) {
  case 0:
    if (sVar1 < 1) {
LAB_001691f9:
      *np = 0;
      lVar13 = 1;
    }
    else {
      pCVar3 = GA[lVar23].mapc;
      uVar12 = 0;
      lVar13 = 0;
      do {
        lVar24 = lo[uVar12];
        uVar21 = (uint)((double)lVar24 * GA[lVar23].scale[uVar12]);
        uVar14 = GA[lVar23].nblock[uVar12];
        uVar17 = uVar14 - 1;
        if (uVar14 == uVar21) {
          uVar21 = uVar17;
        }
        lVar8 = (long)(int)uVar21;
        if (lVar24 < pCVar3[lVar13 + lVar8]) {
          plVar11 = pCVar3 + lVar13 + ((ulong)uVar21 - 1);
          do {
            uVar18 = uVar17;
            if ((int)uVar21 < 1) break;
            uVar18 = uVar21 - 1;
            lVar8 = *plVar11;
            plVar11 = plVar11 + -1;
            uVar21 = uVar18;
          } while (lVar24 < lVar8);
        }
        else {
          uVar16 = uVar17;
          if ((int)uVar17 < (int)uVar21) {
            uVar16 = uVar21;
          }
          lVar7 = 0;
          do {
            uVar18 = uVar17;
            if ((int)uVar16 - lVar8 == lVar7) goto LAB_00168bab;
            lVar19 = lVar7 + 1;
            lVar20 = lVar7 + 1;
            lVar7 = lVar19;
          } while (pCVar3[lVar13 + lVar8 + lVar20] <= lVar24);
          uVar18 = (uVar21 + (int)lVar19) - 1;
        }
LAB_00168bab:
        local_1e8[uVar12 - 0x10] = uVar18;
        lVar13 = lVar13 + (int)uVar14;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar27);
      if (sVar1 < 1) goto LAB_001691f9;
      pCVar3 = GA[lVar23].mapc;
      uVar12 = 0;
      lVar13 = 0;
      do {
        lVar24 = hi[uVar12];
        uVar21 = (uint)((double)lVar24 * GA[lVar23].scale[uVar12]);
        uVar14 = GA[lVar23].nblock[uVar12];
        uVar17 = uVar14 - 1;
        if (uVar14 == uVar21) {
          uVar21 = uVar17;
        }
        lVar8 = (long)(int)uVar21;
        if (lVar24 < pCVar3[lVar13 + lVar8]) {
          plVar11 = pCVar3 + lVar13 + ((ulong)uVar21 - 1);
          do {
            uVar18 = uVar17;
            if ((int)uVar21 < 1) break;
            uVar18 = uVar21 - 1;
            lVar8 = *plVar11;
            plVar11 = plVar11 + -1;
            uVar21 = uVar18;
          } while (lVar24 < lVar8);
        }
        else {
          uVar16 = uVar17;
          if ((int)uVar17 < (int)uVar21) {
            uVar16 = uVar21;
          }
          lVar7 = 0;
          do {
            uVar18 = uVar17;
            if ((int)uVar16 - lVar8 == lVar7) goto LAB_00168c90;
            lVar19 = lVar7 + 1;
            lVar20 = lVar7 + 1;
            lVar7 = lVar19;
          } while (pCVar3[lVar13 + lVar8 + lVar20] <= lVar24);
          uVar18 = (uVar21 + (int)lVar19) - 1;
        }
LAB_00168c90:
        auStack_178[uVar12] = uVar18;
        lVar13 = lVar13 + (int)uVar14;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar27);
      *np = 0;
      if (sVar1 < 1) {
        lVar13 = 1;
      }
      else {
        memcpy(local_1e8,local_228,uVar27 * 4);
        lVar13 = 1;
        uVar12 = 0;
        do {
          lVar13 = lVar13 * (int)((auStack_178[uVar12] - local_1e8[uVar12 - 0x10]) + 1);
          uVar12 = uVar12 + 1;
        } while (uVar27 != uVar12);
        if (lVar13 < 1) {
          return 1;
        }
      }
    }
    local_180 = map + uVar27;
    local_230 = uVar27 * 8;
    local_188 = uVar27 * 8 & 0x7fffffff8;
    lVar8 = 0;
    lVar24 = 0;
    do {
      uVar12 = local_230;
      if (sVar1 < 1) {
        if (pgVar6[lVar23].num_rstrctd == 0) {
          lVar7 = 1;
          CVar26 = 0;
          goto LAB_001693bf;
        }
        lVar7 = 1;
        CVar26 = 0;
        if (0 < pgVar6[lVar23].num_rstrctd) goto LAB_00169308;
LAB_00169524:
        CVar26 = pgVar6[lVar23].rstrctd_list[CVar26];
      }
      else {
        CVar26 = 0;
        uVar25 = 0;
        lVar7 = 1;
        do {
          lVar19 = lVar7;
          if ((long)uVar25 < (long)(uVar27 - 1)) {
            lVar19 = pgVar6[g_a + 1000].nblock[uVar25] * lVar7;
          }
          CVar26 = CVar26 + lVar7 * (int)local_1e8[uVar25];
          uVar25 = uVar25 + 1;
          lVar7 = lVar19;
        } while (uVar27 != uVar25);
        if (pgVar6[lVar23].num_rstrctd == 0) {
          lVar7 = 1;
          if (0 < sVar1) {
            uVar25 = 0;
            do {
              lVar7 = lVar7 * pgVar6[lVar23].nblock[uVar25];
              uVar25 = uVar25 + 1;
            } while (uVar27 != uVar25);
          }
LAB_001693bf:
          if ((CVar26 < 0) || (lVar7 <= CVar26)) goto LAB_00169462;
          if (0 < sVar1) {
            pCVar3 = pgVar6[lVar23].mapc;
            uVar12 = 0;
            lVar19 = 0;
            lVar7 = CVar26;
            do {
              lVar15 = (long)pgVar6[g_a + 1000].nblock[uVar12];
              lVar20 = lVar7 % lVar15;
              local_138[uVar12] = pCVar3[lVar20 + lVar19];
              if (lVar20 == lVar15 + -1) {
                CVar10 = pgVar6[g_a + 1000].dims[uVar12];
              }
              else {
                CVar10 = pCVar3[lVar20 + lVar19 + 1] + -1;
              }
              lVar19 = lVar19 + lVar15;
              alStack_1d0[uVar12 + 1] = CVar10;
              uVar12 = uVar12 + 1;
              lVar7 = lVar7 / lVar15;
            } while (uVar27 != uVar12);
LAB_00169439:
            if (sVar1 < 1) goto LAB_0016951a;
            goto LAB_001694b6;
          }
        }
        else {
          uVar12 = local_188;
          if (CVar26 < pgVar6[lVar23].num_rstrctd) {
            lVar7 = 1;
            if (0 < sVar1) {
              uVar12 = 0;
              do {
                lVar7 = lVar7 * pgVar6[g_a + 1000].nblock[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar27 != uVar12);
            }
LAB_00169308:
            uVar12 = local_230;
            if ((-1 < CVar26) && (CVar26 < lVar7)) {
              if (0 < sVar1) {
                pCVar3 = pgVar6[lVar23].mapc;
                uVar12 = 0;
                lVar19 = 0;
                lVar7 = CVar26;
                do {
                  lVar15 = (long)pgVar6[g_a + 1000].nblock[uVar12];
                  lVar20 = lVar7 % lVar15;
                  local_138[uVar12] = pCVar3[lVar20 + lVar19];
                  if (lVar20 == lVar15 + -1) {
                    CVar10 = pgVar6[g_a + 1000].dims[uVar12];
                  }
                  else {
                    CVar10 = pCVar3[lVar20 + lVar19 + 1] + -1;
                  }
                  lVar19 = lVar19 + lVar15;
                  alStack_1d0[uVar12 + 1] = CVar10;
                  uVar12 = uVar12 + 1;
                  lVar7 = lVar7 / lVar15;
                } while (uVar27 != uVar12);
                goto LAB_00169439;
              }
              goto LAB_0016951a;
            }
          }
LAB_00169462:
          if (0 < sVar1) {
            memset(local_138,0,uVar12);
            memset(alStack_1d0 + 1,0xff,uVar12);
LAB_001694b6:
            lVar8 = lVar8 * uVar27 * 2;
            uVar12 = 0;
            do {
              lVar7 = local_138[uVar12];
              if (local_138[uVar12] < lo[uVar12]) {
                lVar7 = lo[uVar12];
              }
              map[lVar8 + uVar12] = lVar7;
              uVar12 = uVar12 + 1;
            } while (uVar27 != uVar12);
            if (0 < sVar1) {
              uVar12 = 0;
              do {
                lVar7 = alStack_1d0[uVar12 + 1];
                if (hi[uVar12] < alStack_1d0[uVar12 + 1]) {
                  lVar7 = hi[uVar12];
                }
                local_180[lVar8 + uVar12] = lVar7;
                uVar12 = uVar12 + 1;
              } while (uVar27 != uVar12);
            }
          }
        }
LAB_0016951a:
        if (pgVar6[lVar23].num_rstrctd != 0) goto LAB_00169524;
      }
      proclist[lVar24] = CVar26;
      if (0 < sVar1) {
        uVar12 = 0;
        do {
          if ((int)local_1e8[uVar12] < (int)auStack_178[uVar12]) {
            local_1e8[uVar12] = local_1e8[uVar12] + 1;
            break;
          }
          local_1e8[uVar12] = local_1e8[uVar12 - 0x10];
          uVar12 = uVar12 + 1;
        } while (uVar27 != uVar12);
      }
      lVar8 = *np + 1;
      *np = lVar8;
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar13);
    break;
  case 1:
    lVar23 = GA[lVar23].block_total;
    if (lVar23 < 1) {
      *np = 0;
    }
    else {
      lVar13 = 0;
      lVar24 = 0;
      do {
        pnga_distribution(g_a,lVar13,local_138,alStack_1d0 + 1);
        if (0 < sVar1) {
          lVar8 = 0;
          do {
            if (((local_138[lVar8] < lo[lVar8]) || (hi[lVar8] < local_138[lVar8])) &&
               ((alStack_1d0[lVar8 + 1] < lo[lVar8] || (hi[lVar8] < alStack_1d0[lVar8 + 1]))))
            goto LAB_00168d9f;
            lVar8 = lVar8 + 1;
          } while (lVar8 < (long)uVar27);
        }
        proclist[lVar24] = lVar13;
        lVar24 = lVar24 + 1;
LAB_00168d9f:
        lVar13 = lVar13 + 1;
      } while (lVar13 != lVar23);
      *np = lVar24;
      if (0 < lVar24) {
        lVar23 = 0;
        local_278 = map;
        do {
          pnga_distribution(g_a,proclist[lVar23],local_138,alStack_1d0 + 1);
          if (0 < sVar1) {
            uVar12 = 0;
            do {
              lVar13 = local_138[uVar12];
              if (local_138[uVar12] < lo[uVar12]) {
                lVar13 = lo[uVar12];
              }
              local_278[uVar12] = lVar13;
              lVar13 = alStack_1d0[uVar12 + 1];
              if (hi[uVar12] < alStack_1d0[uVar12 + 1]) {
                lVar13 = hi[uVar12];
              }
              local_278[uVar27 + uVar12] = lVar13;
              uVar12 = uVar12 + 1;
            } while (uVar27 != uVar12);
          }
          lVar23 = lVar23 + 1;
          local_278 = local_278 + uVar27 * 2;
        } while (lVar23 != lVar24);
      }
    }
    break;
  case 2:
  case 3:
    if (0 < sVar1) {
      uVar12 = 0;
      do {
        lVar23 = GA[g_a + 1000].block_dims[uVar12];
        lVar13 = (lo[uVar12] + -1) / lVar23;
        local_138[uVar12] = lVar13;
        alStack_1d0[uVar12 + 1] = (hi[uVar12] + -1) / lVar23;
        local_228[uVar12] = lVar13;
        uVar12 = uVar12 + 1;
      } while (uVar27 != uVar12);
    }
    lVar23 = alStack_1d0[uVar27];
    if (lVar23 < (long)(&local_230)[uVar27]) {
      lVar13 = 0;
    }
    else {
      lVar13 = 0;
      do {
        lVar24 = local_228[0];
        if (sVar1 < 1) {
          proclist[lVar13] = 0;
LAB_00168f92:
          local_228[0] = local_228[0] + 1;
        }
        else {
          lVar8 = 1;
          lVar7 = 0;
          uVar12 = uVar27;
          do {
            lVar7 = lVar7 * lVar8 + (&local_230)[uVar12];
            lVar8 = lVar8 * GA[g_a + 1000].block_dims[uVar12 + 6];
            uVar25 = uVar12 - 1;
            bVar4 = 0 < (long)uVar12;
            uVar12 = uVar25;
          } while (uVar25 != 0 && bVar4);
          proclist[lVar13] = lVar7;
          if (sVar1 < 1) goto LAB_00168f92;
          plVar11 = local_228;
          lVar8 = g_a * 0x368;
          pIVar22 = map;
          uVar12 = uVar27;
          do {
            pgVar6 = GA;
            lVar7 = *plVar11;
            *pIVar22 = *(long *)((long)GA[1000].block_dims + lVar8) * lVar7 + 1;
            lVar19 = (lVar7 + 1) * *(long *)((long)pgVar6[1000].block_dims + lVar8);
            pIVar22[uVar27] = lVar19;
            lVar7 = *(long *)((long)pgVar6[1000].dims + lVar8);
            if (lVar7 <= lVar19) {
              lVar19 = lVar7;
            }
            pIVar22[uVar27] = lVar19;
            plVar11 = plVar11 + 1;
            lVar8 = lVar8 + 8;
            pIVar22 = pIVar22 + 1;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
          local_228[0] = local_228[0] + 1;
          if ((0 < sVar1) && (alStack_1d0[1] <= lVar24)) {
            lVar24 = 0;
            do {
              if (lVar24 < (long)(uVar27 - 1)) {
                local_228[lVar24] = local_138[lVar24];
                lVar8 = local_228[lVar24 + 1] + 1;
                local_228[lVar24 + 1] = lVar8;
              }
              else {
                lVar8 = local_228[lVar24 + 1];
              }
            } while ((lVar24 + 1 < (long)uVar27) &&
                    (uVar5 = lVar24 + 2, lVar24 = lVar24 + 1, alStack_1d0[uVar5] < lVar8));
          }
        }
        lVar13 = lVar13 + 1;
        map = map + uVar27 * 2;
      } while ((long)(&local_230)[uVar27] <= lVar23);
    }
    *np = lVar13;
    break;
  case 4:
    if (sVar1 < 1) {
LAB_00168fb5:
      *np = 0;
      lVar13 = 1;
    }
    else {
      pCVar3 = GA[lVar23].mapc;
      uVar12 = 0;
      lVar13 = 0;
      do {
        lVar24 = lo[uVar12];
        uVar14 = (uint)((double)lVar24 * GA[lVar23].scale[uVar12]);
        lVar8 = GA[lVar23].num_blocks[uVar12];
        uVar21 = (int)lVar8 - 1;
        if (lVar8 == (int)uVar14) {
          uVar14 = uVar21;
        }
        if (lVar24 < pCVar3[lVar13 + (int)uVar14]) {
          plVar11 = pCVar3 + lVar13 + ((ulong)uVar14 - 1);
          do {
            uVar16 = uVar21;
            if ((int)uVar14 < 1) break;
            uVar14 = uVar14 - 1;
            lVar7 = *plVar11;
            plVar11 = plVar11 + -1;
            uVar16 = uVar14;
          } while (lVar24 < lVar7);
        }
        else {
          uVar17 = uVar14 - 1;
          lVar7 = (long)(int)uVar14;
          do {
            uVar16 = uVar21;
            if (lVar8 + -1 <= lVar7) break;
            uVar17 = uVar17 + 1;
            lVar19 = lVar7 + 1;
            lVar7 = lVar7 + 1;
            uVar16 = uVar17;
          } while (pCVar3[lVar13 + lVar19] <= lVar24);
        }
        local_1e8[uVar12 - 0x10] = uVar16;
        lVar13 = lVar13 + lVar8;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar27);
      if (sVar1 < 1) goto LAB_00168fb5;
      pCVar3 = GA[lVar23].mapc;
      uVar12 = 0;
      lVar13 = 0;
      do {
        lVar24 = hi[uVar12];
        uVar14 = (uint)((double)lVar24 * GA[lVar23].scale[uVar12]);
        lVar8 = GA[lVar23].num_blocks[uVar12];
        uVar21 = (int)lVar8 - 1;
        if (lVar8 == (int)uVar14) {
          uVar14 = uVar21;
        }
        if (lVar24 < pCVar3[lVar13 + (int)uVar14]) {
          plVar11 = pCVar3 + lVar13 + ((ulong)uVar14 - 1);
          do {
            uVar16 = uVar21;
            if ((int)uVar14 < 1) break;
            uVar14 = uVar14 - 1;
            lVar7 = *plVar11;
            plVar11 = plVar11 + -1;
            uVar16 = uVar14;
          } while (lVar24 < lVar7);
        }
        else {
          uVar17 = uVar14 - 1;
          lVar7 = (long)(int)uVar14;
          do {
            uVar16 = uVar21;
            if (lVar8 + -1 <= lVar7) break;
            uVar17 = uVar17 + 1;
            lVar19 = lVar7 + 1;
            lVar7 = lVar7 + 1;
            uVar16 = uVar17;
          } while (pCVar3[lVar13 + lVar19] <= lVar24);
        }
        auStack_178[uVar12] = uVar16;
        lVar13 = lVar13 + lVar8;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar27);
      *np = 0;
      if (sVar1 < 1) {
        lVar13 = 1;
      }
      else {
        memcpy(local_1e8,local_228,uVar27 * 4);
        lVar13 = 1;
        uVar12 = 0;
        do {
          lVar13 = lVar13 * (int)((auStack_178[uVar12] - local_1e8[uVar12 - 0x10]) + 1);
          uVar12 = uVar12 + 1;
        } while (uVar27 != uVar12);
        if (lVar13 < 1) {
          return 1;
        }
      }
    }
    lVar24 = 0;
    do {
      if (sVar1 < 1) {
        proclist[lVar24] = 0;
      }
      else {
        lVar7 = 0;
        uVar12 = 0;
        lVar8 = 1;
        do {
          lVar19 = lVar8;
          if ((long)uVar12 < (long)(uVar27 - 1)) {
            lVar19 = pgVar6[g_a + 1000].num_blocks[uVar12] * lVar8;
          }
          lVar7 = lVar7 + lVar8 * (int)local_1e8[uVar12];
          uVar12 = uVar12 + 1;
          lVar8 = lVar19;
        } while (uVar27 != uVar12);
        proclist[lVar24] = lVar7;
        lVar8 = pgVar6[lVar23].num_blocks[0];
        lVar19 = (long)(int)lVar7 % lVar8;
        local_158[0] = (int)lVar19;
        if (1 < sVar1) {
          lVar20 = 0;
          do {
            lVar7 = (long)((int)lVar7 - (int)lVar19) / lVar8;
            lVar8 = pgVar6[g_a + 1000].num_blocks[lVar20 + 1];
            lVar19 = (long)(int)lVar7 % lVar8;
            local_158[lVar20 + 1] = (int)lVar19;
            lVar20 = lVar20 + 1;
          } while ((uVar27 & 0xffffffff) - 1 != lVar20);
        }
        if (0 < sVar1) {
          pCVar3 = pgVar6[lVar23].mapc;
          lVar8 = 0;
          iVar9 = 0;
          do {
            iVar2 = *(int *)((long)local_158 + lVar8);
            lVar19 = (long)iVar9 + (long)iVar2;
            *(C_Integer *)((long)local_138 + lVar8 * 2) = pCVar3[lVar19];
            lVar7 = *(long *)((long)pgVar6[lVar23].num_blocks + lVar8 * 2);
            if ((long)iVar2 < lVar7 + -1) {
              lVar19 = pCVar3[lVar19 + 1] + -1;
            }
            else {
              lVar19 = *(long *)((long)pgVar6[lVar23].dims + lVar8 * 2);
            }
            *(long *)((long)alStack_1d0 + lVar8 * 2 + 8U) = lVar19;
            iVar9 = iVar9 + (int)lVar7;
            lVar8 = lVar8 + 4;
          } while ((uVar27 & 0xffffffff) << 2 != lVar8);
          if (0 < sVar1) {
            lVar8 = *np * uVar27 * 2;
            uVar12 = 0;
            do {
              lVar7 = local_138[uVar12];
              if (local_138[uVar12] < lo[uVar12]) {
                lVar7 = lo[uVar12];
              }
              map[lVar8 + uVar12] = lVar7;
              uVar12 = uVar12 + 1;
            } while (uVar27 != uVar12);
            if (0 < sVar1) {
              uVar12 = 0;
              do {
                lVar7 = alStack_1d0[uVar12 + 1];
                if (hi[uVar12] < alStack_1d0[uVar12 + 1]) {
                  lVar7 = hi[uVar12];
                }
                map[uVar27 + lVar8 + uVar12] = lVar7;
                uVar12 = uVar12 + 1;
              } while (uVar27 != uVar12);
              if (0 < sVar1) {
                uVar12 = 0;
                do {
                  if ((int)local_1e8[uVar12] < (int)auStack_178[uVar12]) {
                    local_1e8[uVar12] = local_1e8[uVar12] + 1;
                    break;
                  }
                  local_1e8[uVar12] = local_1e8[uVar12 - 0x10];
                  uVar12 = uVar12 + 1;
                } while (uVar27 != uVar12);
              }
            }
          }
        }
      }
      *np = *np + 1;
      lVar24 = lVar24 + 1;
    } while (lVar24 != lVar13);
  }
  return 1;
}

Assistant:

logical pnga_locate_region( Integer g_a,
                            Integer *lo,
                            Integer *hi,
                            Integer *map,
                            Integer *proclist,
                            Integer *np)
/*    g_a      [input]  global array handle
      lo       [input]  lower indices of patch in global array
      hi       [input]  upper indices of patch in global array
      map      [output] list of lower and upper indices for portion of
                        patch that exists on each processor containing a
                        portion of the patch. The map is constructed so
                        that for a D dimensional global array, the first
                        D elements are the lower indices on the first
                        processor in proclist, the next D elements are
                        the upper indices of the first processor in
                        proclist, the next D elements are the lower
                        indices for the second processor in proclist, and
                        so on.
      proclist [output] list of processors containing some portion of the
                        patch
      np       [output] total number of processors containing a portion
                        of the patch

      For a block cyclic data distribution, this function returns a list of
      blocks that cover the region along with the lower and upper indices of
      each block.
*/
{
  int  procT[MAXDIM], procB[MAXDIM], proc_subscript[MAXDIM];
  Integer  proc, owner, i, ga_handle;
  Integer  d, dpos, ndim, elems, use_blocks;
  /* Integer  p_handle; */

  ga_check_handleM(g_a, "nga_locate_region");

  ga_handle = GA_OFFSET + g_a;

  for(d = 0; d< GA[ga_handle].ndim; d++)
    if((lo[d]<1 || hi[d]>GA[ga_handle].dims[d]) ||(lo[d]>hi[d]))return FALSE;

  ndim = GA[ga_handle].ndim;

  if (GA[ga_handle].distr_type == REGULAR) {
    /* find "processor coordinates" for the top left corner and store them
     * in ProcT */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], lo[d], &procT[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    /* find "processor coordinates" for the right bottom corner and store
     * them in procB */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], hi[d], &procB[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    *np = 0;

    /* Find total number of processors containing data and return the
     * result in elems. Also find the lowest "processor coordinates" of the
     * processor block containing data and return these in proc_subscript.
     */
    ga_InitLoopM(&elems, ndim, proc_subscript, procT,procB,GA[ga_handle].nblock);

    /* p_handle = (Integer)GA[ga_handle].p_handle; */
    for(i= 0; i< elems; i++){ 
      Integer _lo[MAXDIM], _hi[MAXDIM];
      Integer  offset;

      /* convert i to owner processor id using the current values in
         proc_subscript */
      ga_ComputeIndexM(&proc, ndim, proc_subscript, GA[ga_handle].nblock); 
      /* get range of global array indices that are owned by owner */
      ga_ownsM(ga_handle, proc, _lo, _hi);

      offset = *np *(ndim*2); /* location in map to put patch range */

      for(d = 0; d< ndim; d++)
        map[d + offset ] = lo[d] < _lo[d] ? _lo[d] : lo[d];

      for(d = 0; d< ndim; d++)
        map[ndim + d + offset ] = hi[d] > _hi[d] ? _hi[d] : hi[d];

      owner = proc;
      if (GA[ga_handle].num_rstrctd == 0) {
        proclist[i] = owner;
      } else {
        proclist[i] = GA[ga_handle].rstrctd_list[owner];
      }
      /* Update to proc_subscript so that it corresponds to the next
       * processor in the block of processors containing the patch */
      ga_UpdateSubscriptM(ndim,proc_subscript,procT,procB,GA[ga_handle].nblock);
      (*np)++;
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    Integer nproc = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    /* find "processor coordinates" for the top left corner and store them
     * in ProcT */
    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].num_blocks[d], 
          GA[ga_handle].scale[d], lo[d], &procT[d]);
      dpos += GA[ga_handle].num_blocks[d];
    }

    /* find "processor coordinates" for the right bottom corner and store
     * them in procB */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].num_blocks[d], 
          GA[ga_handle].scale[d], hi[d], &procB[d]);
      dpos += GA[ga_handle].num_blocks[d];
    }

    *np = 0;

    /* Find total number of processors containing data and return the
     * result in elems. Also find the lowest "processor coordinates" of the
     * processor block containing data and return these in proc_subscript.
     */
    ga_InitLoopM(&elems, ndim, proc_subscript, procT,procB,GA[ga_handle].num_blocks);

    /* p_handle = (Integer)GA[ga_handle].p_handle; */
    for(i= 0; i< elems; i++){ 
      Integer _lo[MAXDIM], _hi[MAXDIM];
      Integer  offset;

      /* convert i to owner processor id using the current values in
         proc_subscript */
      ga_ComputeIndexM(&proc, ndim, proc_subscript, GA[ga_handle].num_blocks); 
      proclist[i] = proc;
      /* get range of global array indices that are owned by owner */
      ga_ownsM(ga_handle, proc, _lo, _hi);

      offset = *np *(ndim*2); /* location in map to put patch range */


      for(d = 0; d< ndim; d++)
        map[d + offset ] = lo[d] < _lo[d] ? _lo[d] : lo[d];

      for(d = 0; d< ndim; d++)
        map[ndim + d + offset ] = hi[d] > _hi[d] ? _hi[d] : hi[d];

      /* Update to proc_subscript so that it corresponds to the next
       * processor in the block of processors containing the patch */
      ga_UpdateSubscriptM(ndim,proc_subscript,procT,procB,GA[ga_handle].num_blocks);
      (*np)++;
    }
  } else if (GA[ga_handle].distr_type == BLOCK_CYCLIC) {
    Integer nblocks = GA[ga_handle].block_total;
    Integer chk, j, tlo[MAXDIM], thi[MAXDIM], cnt;
    Integer offset;
    cnt = 0;
    for (i=0; i<nblocks; i++) {
      /* check to see if this block overlaps with requested block
       * defined by lo and hi */
      chk = 1;
      /* get limits on block i */
      pnga_distribution(g_a,i,tlo,thi);
      for (j=0; j<ndim && chk==1; j++) {
        /* check to see if at least one end point of the interval
         * represented by blo and bhi falls in the interval
         * represented by lo and hi */
        if (!((tlo[j] >= lo[j] && tlo[j] <= hi[j]) ||
              (thi[j] >= lo[j] && thi[j] <= hi[j]))) {
          chk = 0;
        }
      }
      /* store blocks that overlap request region in proclist */
      if (chk) {
        proclist[cnt] = i;
        cnt++;
      }
    }
    *np = cnt;

    /* fill map array with block coordinates */
    for (i=0; i<cnt; i++) {
      offset = i*2*ndim;
      j = proclist[i];
      pnga_distribution(g_a,j,tlo,thi);
      for (j=0; j<ndim; j++) {
        map[offset + j] = lo[j] < tlo[j] ? tlo[j] : lo[j];
        map[offset + ndim + j] = hi[j] > thi[j] ? thi[j] : hi[j];
      }
    }
  } else if (GA[ga_handle].distr_type == SCALAPACK ||
             GA[ga_handle].distr_type == TILED) {
    /* find min and max block coordinates of region */
    Integer min[MAXDIM], max[MAXDIM];
    Integer count[MAXDIM];
    Integer total_blocks = 1;
    Integer cnt = 0;
    Integer offset;
    for (i=0; i<ndim; i++) {
      min[i] = (lo[i]-1)/GA[ga_handle].block_dims[i];
      max[i] = (hi[i]-1)/GA[ga_handle].block_dims[i];
      total_blocks *= (max[i]-min[i]+1);
      count[i] = min[i];
    }
    while (count[ndim-1]<=max[ndim-1]) {
      /* Calculate block index */
      Integer idx = 0;
      Integer factor = 1;
      Integer iproc;
      Integer p_handle = GA[ga_handle].p_handle;
      Integer size = pnga_pgroup_nnodes(p_handle);
      for (i=ndim-1; i>=0; i--) {
        idx = idx*factor+count[i];
        factor *= GA[ga_handle].num_blocks[i];
      }
      proclist[cnt] = idx;
      /* store information on this block */
      offset = 2*cnt*ndim;
      for (i=0; i<ndim; i++) {
        map[offset+i] = count[i]*GA[ga_handle].block_dims[i]+1;
        map[offset+ndim+i] = (count[i]+1)*GA[ga_handle].block_dims[i];
        if (map[offset+ndim+i] > GA[ga_handle].dims[i])
          map[offset+ndim+i] = GA[ga_handle].dims[i];
      }
      cnt++;
      /* Increment count array */
      i = 0;
      count[0]++;
      while (count[i] > max[i] && i<ndim) {
        if (i<ndim-1) count[i] = min[i];
        if (i<ndim-1) {
          count[i+1]++;
        }
        i++;
      }
    }
    *np = cnt;
  }
  return(TRUE);
}